

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

ssize_t archive_write_gnutar_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  int ret;
  gnutar *gnutar;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  puVar1 = (ulong *)a->format_data;
  gnutar = (gnutar *)s;
  if (*puVar1 < s) {
    gnutar = (gnutar *)*puVar1;
  }
  iVar2 = __archive_write_output(a,buff,(size_t)gnutar);
  *puVar1 = *puVar1 - (long)gnutar;
  if (iVar2 == 0) {
    a_local = (archive_write *)gnutar;
  }
  else {
    a_local = (archive_write *)(long)iVar2;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
archive_write_gnutar_data(struct archive_write *a, const void *buff, size_t s)
{
	struct gnutar *gnutar;
	int ret;

	gnutar = (struct gnutar *)a->format_data;
	if (s > gnutar->entry_bytes_remaining)
		s = (size_t)gnutar->entry_bytes_remaining;
	ret = __archive_write_output(a, buff, s);
	gnutar->entry_bytes_remaining -= s;
	if (ret != ARCHIVE_OK)
		return (ret);
	return (s);
}